

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_type_primitive_createTemporaryReferenceType
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  uint uVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  sysbvm_tuple_t *psVar5;
  anon_struct_72_9_25296aa9 gcFrame;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_object_tuple_t *local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_tuple_t local_58;
  sysbvm_tuple_t local_48;
  sysbvm_tuple_t sStack_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *puStack_20;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  uVar4 = *arguments;
  local_98 = arguments[1];
  sStack_90 = arguments[2];
  local_68 = 0;
  sStack_60 = 0;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = (sysbvm_object_tuple_t *)0x0;
  sStack_80 = 0;
  local_58 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 9;
  puStack_20 = (undefined1 *)&local_98;
  sysbvm_stackFrame_pushRecord(&local_38);
  if (sStack_90 == 0) {
    sysbvm_error("Expected a valid address space for pointer type.");
  }
  local_88 = sysbvm_context_allocatePointerTuple
                       (context,(context->roots).temporaryReferenceType,0x21);
  if (((uVar4 & 0xf) == 0 && uVar4 != 0) && (0xf < *(uint *)(uVar4 + 0xc))) {
    *(sysbvm_object_tuple_t **)(uVar4 + 0x18) = local_88;
  }
  local_88[4].field_1.pointers[0] = 0x890b;
  local_88[3].field_1.pointers[0] = 0xb;
  sVar3 = sysbvm_array_create(context,0);
  local_88[2].header.identityHashAndFlags = (int)sVar3;
  local_88[2].header.objectSize = (int)(sVar3 >> 0x20);
  local_88[2].header.field_0 =
       (anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0)
       (context->roots).anyTemporaryReferenceType;
  uVar1 = context->targetWordSize;
  uVar4 = (ulong)uVar1 << 4 | 0xb;
  local_88[4].header.identityHashAndFlags = (int)uVar4;
  local_88[4].header.objectSize = (int)(uVar4 >> 0x20);
  _Var2 = sysbvm_tuple_isKindOf(context,sStack_90,(context->roots).memberAddressSpaceType);
  local_88[4].header.field_0.typePointer = ((ulong)uVar1 << _Var2) << 4 | 0xb;
  local_88[10].header.identityHashAndFlags = (undefined4)local_98;
  local_88[10].header.objectSize = local_98._4_4_;
  local_88[10].field_1.pointers[0] = sStack_90;
  sStack_60 = sysbvm_pointerLikeType_createPointerLikeStoreFunction
                        (context,(sysbvm_tuple_t)local_88,local_98,0x1000);
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)local_88,(context->roots).assignmentSelector,sStack_60);
  sVar3._0_4_ = local_88[0xb].header.identityHashAndFlags;
  sVar3._4_4_ = local_88[0xb].header.objectSize;
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)local_88,(context->roots).refStoreSelector,sVar3);
  local_88[0xb].header.identityHashAndFlags = (undefined4)sStack_60;
  local_88[0xb].header.objectSize = sStack_60._4_4_;
  local_58 = sysbvm_pointerLikeType_createPointerLikeLoadFunction
                       (context,(sysbvm_tuple_t)local_88,local_98,0x1000);
  local_88[0xb].header.field_0.typePointer = local_58;
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)local_88,(context->roots).refLoadSelector,local_58);
  psVar5 = &local_48;
  local_48 = local_98;
  sStack_40 = sStack_90;
  sStack_80 = sysbvm_function_apply(context,(context->roots).pointerTypeTemplate,2,psVar5,0);
  sStack_70 = sysbvm_pointerLikeType_createPointerLikeReinterpretCast
                        (context,(sysbvm_tuple_t)local_88,sStack_80,(sysbvm_bitflags_t)psVar5);
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)local_88,(context->roots).addressSelector,sStack_70);
  local_48 = local_98;
  sStack_40 = sStack_90;
  psVar5 = &local_48;
  local_78 = sysbvm_function_apply(context,(context->roots).referenceTypeTemplate,2,psVar5,0);
  local_68 = sysbvm_pointerLikeType_createPointerLikeReinterpretCast
                       (context,(sysbvm_tuple_t)local_88,local_78,(sysbvm_bitflags_t)psVar5);
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)local_88,(context->roots).tempRefAsRefSelector,local_68);
  return (sysbvm_tuple_t)local_88;
}

Assistant:

static sysbvm_tuple_t sysbvm_type_primitive_createTemporaryReferenceType(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)arguments;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    return sysbvm_type_doCreateTemporaryReferenceType(context, arguments[0], arguments[1], arguments[2]);
}